

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BayesianProbitRegressor::Clear(BayesianProbitRegressor *this)

{
  string *psVar1;
  Arena *pAVar2;
  BayesianProbitRegressor *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
  Clear(&this->features_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->regressioninputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->optimisminputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->samplingscaleinputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->samplingtruncationinputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->meanoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->varianceoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->pessimisticprobabilityoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->sampledprobabilityoutputfeaturename_,psVar1);
  pAVar2 = GetArenaNoVirtual(this);
  if (((pAVar2 == (Arena *)0x0) && (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0)) &&
     (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0)) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->bias_ = (BayesianProbitRegressor_Gaussian *)0x0;
  this->numberoffeatures_ = 0;
  return;
}

Assistant:

void BayesianProbitRegressor::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BayesianProbitRegressor)
  features_.Clear();
  regressioninputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  optimisminputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  samplingscaleinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  samplingtruncationinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  meanoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  varianceoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  pessimisticprobabilityoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  sampledprobabilityoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  numberoffeatures_ = 0u;
}